

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_taproot.cpp
# Opt level: O1

void __thiscall
cfd::core::TaprootScriptTree::TaprootScriptTree
          (TaprootScriptTree *this,uint8_t leaf_version,Script *script)

{
  long lVar1;
  CfdException *this_00;
  long lVar2;
  byte local_49;
  string local_48;
  
  local_49 = leaf_version;
  TapBranch::TapBranch(&this->super_TapBranch);
  (this->super_TapBranch)._vptr_TapBranch = (_func_int **)&PTR__TaprootScriptTree_00740b18;
  (this->nodes_).super__Vector_base<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->nodes_).super__Vector_base<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->nodes_).super__Vector_base<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->super_TapBranch).has_leaf_ = true;
  (this->super_TapBranch).leaf_version_ = local_49;
  Script::operator=(&(this->super_TapBranch).script_,script);
  if (local_49 != 0x66) {
    lVar1 = 0;
    do {
      lVar2 = lVar1;
      if (lVar2 == 0x20) goto LAB_0036ac29;
      lVar1 = lVar2 + 4;
    } while (*(uint *)((long)TaprootUtil::IsValidLeafVersion::kValidLeafVersions + lVar2 + 4) !=
             (uint)local_49);
    if (lVar2 == 0x20) {
LAB_0036ac29:
      if (((local_49 & 1) != 0) || (0x3e < (byte)(local_49 + 0x40))) {
        local_48._M_dataplus._M_p = "cfdcore_taproot.cpp";
        local_48._M_string_length._0_4_ = 0x1cf;
        local_48.field_2._M_allocated_capacity = (long)"CfdInitializeTaprootScriptTree" + 0xd;
        logger::log<unsigned_char&>
                  ((CfdSourceLocation *)&local_48,kCfdLogLevelWarning,
                   "Unsupported leaf version. [{}]",&local_49);
        this_00 = (CfdException *)__cxa_allocate_exception(0x30);
        local_48._M_dataplus._M_p = (pointer)&local_48.field_2;
        ::std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_48,"Unsupported leaf version.","");
        CfdException::CfdException(this_00,kCfdIllegalArgumentError,&local_48);
        __cxa_throw(this_00,&CfdException::typeinfo,CfdException::~CfdException);
      }
    }
  }
  return;
}

Assistant:

TaprootScriptTree::TaprootScriptTree(
    uint8_t leaf_version, const Script& script)
    : TapBranch() {
  has_leaf_ = true;
  leaf_version_ = leaf_version;
  script_ = script;
  if (!TaprootUtil::IsValidLeafVersion(leaf_version)) {
    warn(CFD_LOG_SOURCE, "Unsupported leaf version. [{}]", leaf_version);
    throw CfdException(
        CfdError::kCfdIllegalArgumentError, "Unsupported leaf version.");
  }
}